

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O1

void on_event_sender_state_changed_callback
               (void *context,MESSAGE_SENDER_STATE new_state,MESSAGE_SENDER_STATE previous_state)

{
  time_t tVar1;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  TELEMETRY_MESSENGER_INSTANCE_conflict *instance;
  
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                 ,"on_event_sender_state_changed_callback",0x17e,1,
                 "on_event_sender_state_changed_callback was invoked with a NULL context; although unexpected, this failure will be ignored"
                );
      return;
    }
  }
  else if (new_state != previous_state) {
    *(MESSAGE_SENDER_STATE *)((long)context + 0x80) = new_state;
    *(MESSAGE_SENDER_STATE *)((long)context + 0x84) = previous_state;
    tVar1 = get_time((time_t *)0x0);
    *(time_t *)((long)context + 0xb8) = tVar1;
  }
  return;
}

Assistant:

static void on_event_sender_state_changed_callback(void* context, MESSAGE_SENDER_STATE new_state, MESSAGE_SENDER_STATE previous_state)
{
    if (context == NULL)
    {
        LogError("on_event_sender_state_changed_callback was invoked with a NULL context; although unexpected, this failure will be ignored");
    }
    else
    {
        if (new_state != previous_state)
        {
            TELEMETRY_MESSENGER_INSTANCE* instance = (TELEMETRY_MESSENGER_INSTANCE*)context;
            instance->message_sender_current_state = new_state;
            instance->message_sender_previous_state = previous_state;
            instance->last_message_sender_state_change_time = get_time(NULL);
        }
    }
}